

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int attlist2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ulong uVar1;
  int iVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = 0;
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x17) {
    pcVar3 = attlist3;
  }
  else {
    if (tok == 0x12) {
      iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"CDATA");
      if (iVar2 == 0) {
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          bVar5 = 6 < uVar4;
          if (uVar4 == 7) {
            iVar2 = 7;
            goto LAB_00160890;
          }
          iVar2 = (*enc->nameMatchesAscii)
                            (enc,ptr,end,
                             attlist2_types_rel + *(int *)(attlist2_types_rel + uVar4 * 4 + 4));
          uVar1 = uVar4 + 1;
        } while (iVar2 == 0);
        bVar5 = 6 < uVar4;
        iVar2 = (int)(uVar4 + 1) + 0x14;
      }
      else {
        iVar2 = 0x14;
        bVar5 = false;
      }
      state->handler = attlist8;
LAB_00160890:
      if (!bVar5) {
        return iVar2;
      }
      iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"NOTATION");
      if (iVar2 != 0) {
        iVar2 = 0;
        pcVar3 = attlist5;
        goto LAB_001608d4;
      }
    }
    iVar2 = -1;
    pcVar3 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
LAB_001608d4:
  state->handler = pcVar3;
  return iVar2;
}

Assistant:

static
int attlist2(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_NAME:
    {
      static const char *types[] = {
        KW_CDATA,
        KW_ID,
        KW_IDREF,
        KW_IDREFS,
        KW_ENTITY,
        KW_ENTITIES,
        KW_NMTOKEN,
        KW_NMTOKENS,
      };
      int i;
      for (i = 0; i < (int)(sizeof(types)/sizeof(types[0])); i++)
        if (XmlNameMatchesAscii(enc, ptr, end, types[i])) {
          state->handler = attlist8;
          return XML_ROLE_ATTRIBUTE_TYPE_CDATA + i;
        }
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NOTATION)) {
      state->handler = attlist5;
      return XML_ROLE_NONE;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = attlist3;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}